

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,initializer_list<int> ranges)

{
  size_type sVar1;
  const_iterator piVar2;
  bool bVar3;
  int *local_30;
  const_iterator range;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  initializer_list<int> ranges_local;
  
  ranges_local._M_array = (iterator)ranges._M_len;
  this_local = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *)ranges._M_array;
  sVar1 = std::initializer_list<int>::size((initializer_list<int> *)&this_local);
  bVar3 = true;
  if (sVar1 != 2) {
    sVar1 = std::initializer_list<int>::size((initializer_list<int> *)&this_local);
    bVar3 = true;
    if (sVar1 != 4) {
      sVar1 = std::initializer_list<int>::size((initializer_list<int> *)&this_local);
      bVar3 = sVar1 == 6;
    }
  }
  if (bVar3) {
    add(this,this->current);
    local_30 = std::initializer_list<int>::begin((initializer_list<int> *)&this_local);
    while( true ) {
      piVar2 = std::initializer_list<int>::end((initializer_list<int> *)&this_local);
      if (local_30 == piVar2) {
        return true;
      }
      get(this);
      bVar3 = false;
      if (*local_30 <= this->current) {
        bVar3 = this->current <= local_30[1];
        local_30 = local_30 + 1;
      }
      if (!bVar3) break;
      add(this,this->current);
      local_30 = local_30 + 1;
    }
    this->error_message = "invalid string: ill-formed UTF-8 byte";
    return false;
  }
  __assert_fail("ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x907,
                "bool nlohmann::detail::lexer<nlohmann::basic_json<>>::next_byte_in_range(std::initializer_list<int>) [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

bool next_byte_in_range(std::initializer_list<int> ranges) {
		assert(ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6);
		add(current);

		for (auto range = ranges.begin(); range != ranges.end(); ++range) {
			get();
			if (JSON_LIKELY(*range <= current and current <= *(++range))) {
				add(current);
			} else {
				error_message = "invalid string: ill-formed UTF-8 byte";
				return false;
			}
		}

		return true;
	}